

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O0

void * uo_tcp_conn_get_user_data(uo_tcp_conn *tcp_conn,char *key)

{
  void *local_28;
  void *user_data;
  char *key_local;
  uo_tcp_conn *tcp_conn_local;
  
  local_28 = uo_strhashtbl_get(&tcp_conn->user_data,key);
  if (local_28 == (void *)0x0) {
    local_28 = uo_strhashtbl_get((tcp_conn->field_1).shared_user_data,key);
  }
  return local_28;
}

Assistant:

void *uo_tcp_conn_get_user_data(
    uo_tcp_conn *tcp_conn,
    const char *key)
{
    void *user_data = uo_strhashtbl_get(&tcp_conn->user_data, key);

    return user_data
        ? user_data
        : uo_strhashtbl_get(tcp_conn->shared_user_data, key);
}